

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O2

void publish_and_basic_get_message(char *msg_to_publish)

{
  int iVar1;
  size_t in_RAX;
  amqp_connection_state_t connection_state_;
  char *__s2;
  size_t sVar2;
  uint64_t body_size;
  size_t local_28;
  
  local_28 = in_RAX;
  connection_state_ = setup_connection_and_channel();
  queue_declare(connection_state_,"test_queue");
  basic_publish(connection_state_,msg_to_publish);
  __s2 = basic_get(connection_state_,"test_queue",&local_28);
  sVar2 = strlen(msg_to_publish);
  if (local_28 != sVar2) {
    __assert_fail("body_size == strlen(msg_to_publish)",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x81,"void publish_and_basic_get_message(const char *)");
  }
  iVar1 = strncmp(msg_to_publish,__s2,local_28);
  if (iVar1 == 0) {
    free(__s2);
    close_and_destroy_connection(connection_state_);
    return;
  }
  __assert_fail("strncmp(msg_to_publish, msg, body_size) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                ,0x82,"void publish_and_basic_get_message(const char *)");
}

Assistant:

void publish_and_basic_get_message(const char *msg_to_publish) {
  amqp_connection_state_t connection_state = setup_connection_and_channel();

  queue_declare(connection_state, test_queue_name);
  basic_publish(connection_state, msg_to_publish);

  uint64_t body_size;
  char *msg = basic_get(connection_state, test_queue_name, &body_size);

  assert(body_size == strlen(msg_to_publish));
  assert(strncmp(msg_to_publish, msg, body_size) == 0);
  free(msg);

  close_and_destroy_connection(connection_state);
}